

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O1

int xmlSaveDocInternal(xmlSaveCtxtPtr ctxt,xmlDocPtr cur,xmlChar *encoding)

{
  xmlElementType xVar1;
  xmlOutputBufferPtr buf;
  xmlNodePtr cur_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  xmlChar *pxVar6;
  xmlDtdPtr pxVar7;
  char *data;
  uint uVar8;
  xmlNodePtr child;
  
  buf = ctxt->buf;
  xmlInitParser();
  xVar1 = cur->type;
  if ((xVar1 | XML_CDATA_SECTION_NODE) != XML_HTML_DOCUMENT_NODE) {
    return -1;
  }
  if (encoding == (xmlChar *)0x0) {
    encoding = cur->encoding;
  }
  if (((xVar1 != XML_HTML_DOCUMENT_NODE) || ((ctxt->options & 0x30) != 0)) &&
     ((ctxt->options & 0x40U) == 0)) {
    bVar3 = false;
    if (xVar1 != XML_DOCUMENT_NODE && (ctxt->options & 0x30U) == 0) goto LAB_0016ecf6;
    bVar3 = false;
    if ((encoding != (xmlChar *)0x0) && (bVar3 = false, ctxt->encoding == (xmlChar *)0x0)) {
      iVar4 = xmlSaveSwitchEncoding(ctxt,(char *)encoding);
      bVar3 = true;
      if (iVar4 < 0) {
        return -1;
      }
    }
    if ((ctxt->options & 2) == 0) {
      xmlOutputBufferWrite(buf,0xe,"<?xml version=");
      if (cur->version == (xmlChar *)0x0) {
        xmlOutputBufferWrite(buf,5,"\"1.0\"");
      }
      else {
        xmlOutputBufferWriteQuotedString(buf,cur->version);
      }
      if (encoding != (xmlChar *)0x0) {
        xmlOutputBufferWrite(buf,10," encoding=");
        xmlOutputBufferWriteQuotedString(buf,encoding);
      }
      if (cur->standalone == 1) {
        data = " standalone=\"yes\"";
        iVar4 = 0x11;
LAB_0016ec5b:
        xmlOutputBufferWrite(buf,iVar4,data);
      }
      else if (cur->standalone == 0) {
        data = " standalone=\"no\"";
        iVar4 = 0x10;
        goto LAB_0016ec5b;
      }
      xmlOutputBufferWrite(buf,3,"?>\n");
    }
    uVar8 = (uint)ctxt->options >> 4 & 1;
    if (((ctxt->options & 8U) == 0) && (pxVar7 = xmlGetIntSubset(cur), pxVar7 != (xmlDtdPtr)0x0)) {
      uVar5 = xmlIsXHTML(pxVar7->SystemID,pxVar7->ExternalID);
      uVar8 = 0;
      if (0 < (int)uVar5) {
        uVar8 = uVar5;
      }
    }
    for (cur_00 = cur->children; cur_00 != (xmlNodePtr)0x0; cur_00 = cur_00->next) {
      ctxt->level = 0;
      if (uVar8 == 0) {
        xmlNodeDumpOutputInternal(ctxt,cur_00);
      }
      else {
        xhtmlNodeDumpOutput(ctxt,cur_00);
      }
      if (1 < cur_00->type - XML_XINCLUDE_START) {
        xmlOutputBufferWrite(buf,1,"\n");
      }
    }
    goto LAB_0016ecf6;
  }
  if (encoding != (xmlChar *)0x0) {
    htmlSetMetaEncoding(cur,encoding);
  }
  bVar3 = false;
  if (ctxt->encoding == (xmlChar *)0x0) {
    if (encoding == (xmlChar *)0x0) {
      pxVar6 = htmlGetMetaEncoding(cur);
      encoding = (xmlChar *)"HTML";
      if (pxVar6 != (xmlChar *)0x0) {
        encoding = pxVar6;
      }
    }
    iVar4 = xmlSaveSwitchEncoding(ctxt,(char *)encoding);
    bVar3 = true;
    if (-1 < iVar4) goto LAB_0016ebcd;
    bVar3 = false;
    bVar2 = false;
  }
  else {
LAB_0016ebcd:
    htmlDocContentDumpFormatOutput(buf,cur,(char *)0x0,ctxt->options & 1);
    bVar2 = true;
  }
  if (!bVar2) {
    return -1;
  }
LAB_0016ecf6:
  if (bVar3) {
    xmlSaveClearEncoding(ctxt);
  }
  return 0;
}

Assistant:

static int
xmlSaveDocInternal(xmlSaveCtxtPtr ctxt, xmlDocPtr cur,
                   const xmlChar *encoding) {
#ifdef LIBXML_HTML_ENABLED
    xmlDtdPtr dtd;
    int is_xhtml = 0;
#endif
    xmlOutputBufferPtr buf = ctxt->buf;
    int switched_encoding = 0;

    xmlInitParser();

    if ((cur->type != XML_HTML_DOCUMENT_NODE) &&
        (cur->type != XML_DOCUMENT_NODE))
	 return(-1);

    if (encoding == NULL)
	encoding = cur->encoding;

    if (((cur->type == XML_HTML_DOCUMENT_NODE) &&
         ((ctxt->options & XML_SAVE_AS_XML) == 0) &&
         ((ctxt->options & XML_SAVE_XHTML) == 0)) ||
        (ctxt->options & XML_SAVE_AS_HTML)) {
#ifdef LIBXML_HTML_ENABLED
        int format = 0;

        if (encoding != NULL)
	    htmlSetMetaEncoding(cur, encoding);

	if (ctxt->encoding == NULL) {
            if (encoding == NULL) {
                encoding = htmlGetMetaEncoding(cur);

                if (encoding == NULL)
                    encoding = BAD_CAST "HTML";
            }

	    if (xmlSaveSwitchEncoding(ctxt, (const char*) encoding) < 0) {
		return(-1);
	    }
            switched_encoding = 1;
	}

        if (ctxt->options & XML_SAVE_FORMAT)
            format = 1;
        htmlDocContentDumpFormatOutput(buf, cur, NULL, format);
#else
        return(-1);
#endif
    } else if ((cur->type == XML_DOCUMENT_NODE) ||
               (ctxt->options & XML_SAVE_AS_XML) ||
               (ctxt->options & XML_SAVE_XHTML)) {
	if ((encoding != NULL) && (ctxt->encoding == NULL)) {
            if (xmlSaveSwitchEncoding(ctxt, (const char *) encoding) < 0)
                return(-1);
            switched_encoding = 1;
	}

	/*
	 * Save the XML declaration
	 */
	if ((ctxt->options & XML_SAVE_NO_DECL) == 0) {
	    xmlOutputBufferWrite(buf, 14, "<?xml version=");
	    if (cur->version != NULL)
		xmlOutputBufferWriteQuotedString(buf, cur->version);
	    else
		xmlOutputBufferWrite(buf, 5, "\"1.0\"");
	    if (encoding != NULL) {
		xmlOutputBufferWrite(buf, 10, " encoding=");
		xmlOutputBufferWriteQuotedString(buf, (xmlChar *) encoding);
	    }
	    switch (cur->standalone) {
		case 0:
		    xmlOutputBufferWrite(buf, 16, " standalone=\"no\"");
		    break;
		case 1:
		    xmlOutputBufferWrite(buf, 17, " standalone=\"yes\"");
		    break;
	    }
	    xmlOutputBufferWrite(buf, 3, "?>\n");
	}

#ifdef LIBXML_HTML_ENABLED
        if (ctxt->options & XML_SAVE_XHTML)
            is_xhtml = 1;
	if ((ctxt->options & XML_SAVE_NO_XHTML) == 0) {
	    dtd = xmlGetIntSubset(cur);
	    if (dtd != NULL) {
		is_xhtml = xmlIsXHTML(dtd->SystemID, dtd->ExternalID);
		if (is_xhtml < 0) is_xhtml = 0;
	    }
	}
#endif
	if (cur->children != NULL) {
	    xmlNodePtr child = cur->children;

	    while (child != NULL) {
		ctxt->level = 0;
#ifdef LIBXML_HTML_ENABLED
		if (is_xhtml)
		    xhtmlNodeDumpOutput(ctxt, child);
		else
#endif
		    xmlNodeDumpOutputInternal(ctxt, child);
                if ((child->type != XML_XINCLUDE_START) &&
                    (child->type != XML_XINCLUDE_END))
                    xmlOutputBufferWrite(buf, 1, "\n");
		child = child->next;
	    }
	}
    }

    /*
     * Restore the state of the saving context at the end of the document
     */
    if (switched_encoding) {
	xmlSaveClearEncoding(ctxt);
    }

    return(0);
}